

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_template_class.cpp
# Opt level: O3

void use_template_class(void)

{
  int iVar1;
  undefined8 *puVar2;
  istream *piVar3;
  long lVar4;
  char *pcVar5;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ss;
  string str;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_60.limit = 10;
  local_60.count = 0;
  puVar2 = (undefined8 *)operator_new__(0x148);
  *puVar2 = 10;
  lVar4 = 0x18;
  do {
    *(long *)((long)puVar2 + lVar4 + -0x10) = (long)puVar2 + lVar4;
    *(undefined8 *)((long)puVar2 + lVar4 + -8) = 0;
    *(undefined1 *)((long)puVar2 + lVar4) = 0;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x158);
  local_60.items = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar2 + 1)
  ;
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please add something to stack(q to quit):\n",0x2a);
  pcVar5 = "stack is full.\n";
  while( true ) {
    piVar3 = std::operator>>((istream *)&std::cin,(string *)&local_50);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    iVar1 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar1 == 0) break;
    lVar4 = (long)local_60.count;
    if (lVar4 == 10) {
      lVar4 = 0xf;
      goto LAB_001154be;
    }
    local_60.count = local_60.count + 1;
    std::__cxx11::string::_M_assign((string *)(local_60.items + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"then again with stack(q to quit):\n",0x22);
  }
  pcVar5 = "ok, leave stack...\n";
  if (local_60.count == 10) {
    pcVar5 = "stack is full.\n";
  }
  lVar4 = (ulong)(local_60.count != 10) * 4 + 0xf;
LAB_001154be:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  L14_4::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Stack(&local_60);
  return;
}

Assistant:

void use_template_class() {
    using namespace L14_4;

    // string stack
    Stack<std::string> ss;
    std::string str;

    std::cout << "Please add something to stack(q to quit):\n";
    while(std::cin >> str && str != "q" && !ss.is_full()) {
        ss.push(str);
        std::cout << "then again with stack(q to quit):\n";
    }
    if (ss.is_full()) {
        std::cout << "stack is full.\n";
    } else {
        std::cout << "ok, leave stack...\n";
    }
}